

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O3

ExpEmit __thiscall FxReturnStatement::Emit(FxReturnStatement *this,VMFunctionBuilder *build)

{
  uint uVar1;
  uint extraout_var;
  uint opb;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar2;
  
  if (this->Value == (FxExpression *)0x0) {
    uVar5 = 0;
    VMFunctionBuilder::Emit(build,0x4e,0x80,0x80,0);
    uVar4 = 0x80;
    iVar6 = 1;
    uVar7 = 0;
    uVar3 = 0;
    uVar2 = 0;
  }
  else {
    uVar1 = (*this->Value->_vptr_FxExpression[9])();
    uVar2 = CONCAT44(extraout_var,uVar1);
    uVar4 = (uint)(uVar2 >> 0x10);
    iVar6 = (int)(uVar2 >> 0x18);
    uVar3 = (ulong)extraout_var;
    uVar7 = (ulong)(extraout_var >> 8);
    uVar5 = (ulong)(extraout_var >> 0x18);
    if ((extraout_var & 0x10000) == 0) {
      if (this->Value->ValueType == &TypeVoid->super_PType) {
        VMFunctionBuilder::Emit(build,0x4e,0x80,0x80,0);
      }
      else {
        opb = uVar1 >> 0x10 & 0xff;
        if ((extraout_var & 1) == 0) {
          if ((char)(uVar1 >> 0x18) == '\x03') {
            opb = opb | 0x10;
          }
          else if (uVar1 >> 0x18 == 2) {
            opb = opb | 8;
          }
        }
        else {
          opb = opb | 4;
        }
        VMFunctionBuilder::Emit(build,0x4e,0x80,opb,uVar1 & 0xffff);
      }
    }
  }
  return (ExpEmit)(uVar2 & 0xffff |
                   (ulong)((uVar4 & 0xff) << 0x10) |
                   (ulong)(uint)(iVar6 << 0x18) |
                   (uVar3 & 0xff) << 0x20 | (uVar7 & 0xff) << 0x28 | uVar5 << 0x38 | 0x1000000000000
                  );
}

Assistant:

ExpEmit FxReturnStatement::Emit(VMFunctionBuilder *build)
{
	ExpEmit out(0, REGT_NIL);

	// If we return nothing, use a regular RET opcode.
	// Otherwise just return the value we're given.
	if (Value == nullptr)
	{
		build->Emit(OP_RET, RET_FINAL, REGT_NIL, 0);
	}
	else
	{
		out = Value->Emit(build);

		// Check if it is a function call that simplified itself
		// into a tail call in which case we don't emit anything.
		if (!out.Final)
		{
			if (Value->ValueType == TypeVoid)
			{ // Nothing is returned.
				build->Emit(OP_RET, RET_FINAL, REGT_NIL, 0);
			}
			else
			{
				build->Emit(OP_RET, RET_FINAL, EncodeRegType(out), out.RegNum);
			}
		}
	}

	out.Final = true;
	return out;
}